

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

uint16_t ucnv_io_getAliases(char *alias,uint16_t start,char **aliases,UErrorCode *pErrorCode)

{
  ushort uVar1;
  uint16_t *puVar2;
  UBool UVar3;
  uint32_t uVar4;
  uint uVar5;
  uint16_t *currList;
  uint32_t listCount;
  int32_t listOffset;
  uint32_t convNum;
  uint32_t currAlias;
  UErrorCode *pErrorCode_local;
  char **aliases_local;
  uint16_t start_local;
  char *alias_local;
  
  UVar3 = haveAliasData(pErrorCode);
  if ((((UVar3 != '\0') && (UVar3 = isAlias(alias,pErrorCode), UVar3 != '\0')) &&
      (uVar4 = findConverter(alias,(UBool *)0x0,pErrorCode), puVar2 = gMainTable.taggedAliasLists,
      uVar4 < gMainTable.converterListSize)) &&
     (uVar5 = (uint)gMainTable.taggedAliasArray
                    [(gMainTable.tagListSize - 1) * gMainTable.converterListSize + uVar4],
     uVar5 != 0)) {
    uVar1 = gMainTable.taggedAliasLists[(int)uVar5];
    for (listOffset = (int32_t)start; (uint)listOffset < (uint)uVar1; listOffset = listOffset + 1) {
      aliases[(uint)listOffset] =
           (char *)(gMainTable.stringTable +
                   (int)(uint)puVar2[(long)(int)uVar5 + (ulong)(uint)listOffset + 1]);
    }
  }
  return 0;
}

Assistant:

static uint16_t
ucnv_io_getAliases(const char *alias, uint16_t start, const char **aliases, UErrorCode *pErrorCode) {
    if(haveAliasData(pErrorCode) && isAlias(alias, pErrorCode)) {
        uint32_t currAlias;
        uint32_t convNum = findConverter(alias, NULL, pErrorCode);
        if (convNum < gMainTable.converterListSize) {
            /* tagListNum - 1 is the ALL tag */
            int32_t listOffset = gMainTable.taggedAliasArray[(gMainTable.tagListSize - 1)*gMainTable.converterListSize + convNum];

            if (listOffset) {
                uint32_t listCount = gMainTable.taggedAliasLists[listOffset];
                /* +1 to skip listCount */
                const uint16_t *currList = gMainTable.taggedAliasLists + listOffset + 1;

                for (currAlias = start; currAlias < listCount; currAlias++) {
                    aliases[currAlias] = GET_STRING(currList[currAlias]);
                }
            }
            /* else this shouldn't happen. internal program error */
        }
        /* else converter not found */
    }
    return 0;
}